

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

objucxdef *
objuini(mcmcxdef *ctx,ushort siz,_func_void_void_ptr_uchar_ptr *undocb,
       _func_ushort_void_ptr_uchar_ptr *sizecb,void *callctx)

{
  objucxdef *poVar1;
  errcxdef *in_RCX;
  _func_void_void_ptr_uchar_ptr *in_RDX;
  ushort in_SI;
  mcmcxdef *in_RDI;
  void *in_R8;
  long totsiz;
  objucxdef *ret;
  char *in_stack_ffffffffffffffd0;
  ushort local_a;
  
  local_a = in_SI;
  if (0xff00 < (ulong)in_SI + 0x3f) {
    local_a = 0xfec1;
  }
  poVar1 = (objucxdef *)mchalo(in_RCX,(size_t)in_R8,in_stack_ffffffffffffffd0);
  poVar1->objucxmem = in_RDI;
  poVar1->objucxerr = in_RDI->mcmcxgl->mcmcxerr;
  poVar1->objucxsiz = local_a;
  poVar1->objucxtop = 0;
  poVar1->objucxtail = 0;
  poVar1->objucxprv = 0;
  poVar1->objucxhead = 0;
  poVar1->objucxcun = in_RDX;
  poVar1->objucxcsz = (_func_ushort_void_ptr_uchar_ptr *)in_RCX;
  poVar1->objucxccx = in_R8;
  return poVar1;
}

Assistant:

objucxdef *objuini(mcmcxdef *ctx, ushort siz,
                   void (*undocb)(void *, uchar *), 
                   ushort (*sizecb)(void *, uchar *),
                   void *callctx)
{
    objucxdef *ret;
    long       totsiz;

    /* force size into valid range */
    totsiz = (long)siz + sizeof(objucxdef) - 1;
    if (totsiz > 0xff00)
        siz = 0xff00 - sizeof(objucxdef) + 1;

    ret = (objucxdef *)mchalo(ctx->mcmcxgl->mcmcxerr,
                              (sizeof(objucxdef) + siz - 1),
                              "objuini");
    
    ret->objucxmem  = ctx;
    ret->objucxerr  = ctx->mcmcxgl->mcmcxerr;
    ret->objucxsiz  = siz;
    ret->objucxhead = ret->objucxprv = ret->objucxtail = ret->objucxtop = 0;
    
    /* set client callback functions */
    ret->objucxcun = undocb;               /* callback to apply client undo */
    ret->objucxcsz = sizecb;         /* callback to get size of client undo */
    ret->objucxccx = callctx;      /* context for client callback functions */
    
    return(ret);
}